

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O1

void __thiscall dynamicgraph::OutStringStream::resize(OutStringStream *this,streamsize *size)

{
  void *pvVar1;
  
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x78 = 0;
  *(streamsize *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x80 =
       *size;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x88 = 0;
  pvVar1 = *(void **)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>
                      .field_0x70;
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  pvVar1 = operator_new__(*size);
  *(void **)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             field_0x70 = pvVar1;
  return;
}

Assistant:

void OutStringStream::resize(const std::streamsize &size) {
  dgDEBUGIN(15);

  index = 0;
  bufferSize = size;
  full = false;

  delete[] buffer;
  buffer = new char[static_cast<size_t>(size)];

  dgDEBUGOUT(15);
}